

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

_Bool telnet_ldisc(Backend *be,int option)

{
  if (option == 0) {
    return (_Bool)*(undefined1 *)((long)&be[-4].vt + 1);
  }
  if (option == 1) {
    return (_Bool)*(undefined1 *)&be[-4].vt;
  }
  return false;
}

Assistant:

static bool telnet_ldisc(Backend *be, int option)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    if (option == LD_ECHO)
        return telnet->echoing;
    if (option == LD_EDIT)
        return telnet->editing;
    return false;
}